

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O0

bool __thiscall TaskSpec::has_lock(Database *this,DatabaseLock *oth)

{
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_CERT_Polska[P]ursadb_libursa_Task_cpp:46:23),_const_std::variant<DatasetLock,_IteratorLock>_&>
  _Var1;
  anon_class_8_1_8991fb9c *in_RSI;
  variant<DatasetLock,_IteratorLock> *in_RDI;
  
  _Var1 = std::
          visit<TaskSpec::has_lock(std::variant<DatasetLock,IteratorLock>const&)const::__0,std::variant<DatasetLock,IteratorLock>const&>
                    (in_RSI,in_RDI);
  return _Var1;
}

Assistant:

bool TaskSpec::has_lock(const DatabaseLock &oth) const {
    return std::visit([this](const auto &l) { return has_typed_lock(l); }, oth);
}